

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::CompressedCubeFormatCase::init
          (CompressedCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  pointer puVar1;
  deUint32 dVar2;
  int extraout_EAX;
  TextureCube *this_00;
  ulong uVar3;
  uint uVar4;
  int face;
  long lVar5;
  vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> levels;
  Random rnd;
  vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> local_60;
  TexDecompressionParams local_44;
  deRandom local_40;
  
  std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::vector
            (&local_60,6,(allocator_type *)&local_40);
  deRandom_init(&local_40,this->m_randomSeed);
  lVar5 = 0;
  do {
    tcu::CompressedTexture::setStorage
              (local_60.
               super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar5,this->m_format,this->m_width,
               this->m_height,1);
    puVar1 = local_60.
             super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar5].m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (int)local_60.
                 super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar5].m_data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (int)puVar1;
    if (0 < (int)uVar4) {
      uVar3 = 0;
      do {
        dVar2 = deRandom_getUint32(&local_40);
        puVar1[uVar3] = (uchar)dVar2;
        uVar3 = uVar3 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar3);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  this_00 = (TextureCube *)operator_new(0x180);
  local_44.astcMode = ASTCMODE_LAST;
  glu::TextureCube::TextureCube
            (this_00,this->m_renderCtx,this->m_renderCtxInfo,1,
             local_60.
             super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_44);
  this->m_texture = this_00;
  this->m_curFace = 0;
  this->m_isOk = true;
  std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::~vector(&local_60);
  return extraout_EAX;
}

Assistant:

void CompressedCubeFormatCase::init (void)
{
	vector<tcu::CompressedTexture>	levels	(tcu::CUBEFACE_LAST);
	de::Random						rnd		(m_randomSeed);

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		levels[face].setStorage(m_format, m_width, m_height);

		int			dataSize	= levels[face].getDataSize();
		deUint8*	data		= (deUint8*)levels[face].getData();

		for (int i = 0; i < dataSize; i++)
			data[i] = rnd.getUint32() & 0xff;
	}

	m_texture = new glu::TextureCube(m_renderCtx, m_renderCtxInfo, 1, &levels[0]);

	m_curFace	= 0;
	m_isOk		= true;
}